

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  IfcDimensionCurveTerminator *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xd8,"IfcDimensionCurveTerminator");
  IfcTerminatorSymbol::IfcTerminatorSymbol
            (&this->super_IfcTerminatorSymbol,&PTR_construction_vtable_24__00e84c38);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator,_1UL> *)
             &(this->super_IfcTerminatorSymbol).field_0xa8,&PTR_construction_vtable_24__00e84d28);
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0xe84b30;
  *(undefined8 *)&this->field_0xd8 = 0xe84c20;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0xe84b58;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0xe84b80;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = 0xe84ba8;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.field_0x90 = 0xe84bd0;
  *(undefined8 *)&(this->super_IfcTerminatorSymbol).field_0xa8 = 0xe84bf8;
  std::__cxx11::string::string((string *)&(this->super_IfcTerminatorSymbol).field_0xb8);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}